

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_equal_wstring
                  (char *file,wchar_t line,wchar_t *v1,char *e1,wchar_t *v2,char *e2,void *extra)

{
  int iVar1;
  char *e2_local;
  wchar_t *v2_local;
  char *e1_local;
  wchar_t *v1_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  if (v1 == v2) {
    file_local._4_4_ = L'\x01';
  }
  else {
    if (((v1 != (wchar_t *)0x0) && (v2 != (wchar_t *)0x0)) && (iVar1 = wcscmp(v1,v2), iVar1 == 0)) {
      return L'\x01';
    }
    failure_start(file,line,"%s != %s",e1,e2);
    wcsdump(e1,v1);
    wcsdump(e2,v2);
    failure_finish(extra);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_equal_wstring(const char *file, int line,
    const wchar_t *v1, const char *e1,
    const wchar_t *v2, const char *e2,
    void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	if (v1 != NULL && v2 != NULL && wcscmp(v1, v2) == 0)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	wcsdump(e1, v1);
	wcsdump(e2, v2);
	failure_finish(extra);
	return (0);
}